

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

VARIABLE_FLAVOUR
gl4cts::GLSL420Pack::Utils::getVariableFlavour
          (SHADER_STAGES stage,VARIABLE_STORAGE storage,qualifierSet *qualifiers)

{
  pointer pQVar1;
  VARIABLE_FLAVOUR VVar2;
  TestError *this;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  VVar2 = BASIC;
  if (storage != UNIFORM) {
    switch(stage) {
    case VERTEX_SHADER:
    case FRAGMENT_SHADER:
      break;
    case TESS_CTRL_SHADER:
      pQVar1 = (qualifiers->
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(qualifiers->
                    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar1;
      bVar7 = lVar3 != 0;
      if ((bVar7) && (*pQVar1 != QUAL_PATCH)) {
        uVar4 = lVar3 >> 2;
        uVar5 = 1;
        do {
          uVar6 = (ulong)uVar5;
          bVar7 = uVar6 < uVar4;
          if (uVar4 <= uVar6) break;
          uVar5 = uVar5 + 1;
        } while (pQVar1[uVar6] != QUAL_PATCH);
      }
      VVar2 = INDEXED_BY_INVOCATION_ID;
      if (storage == OUTPUT) {
        VVar2 = (uint)(bVar7 ^ 1) * 2;
      }
      break;
    case TESS_EVAL_SHADER:
      pQVar1 = (qualifiers->
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(qualifiers->
                    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar1;
      bVar7 = lVar3 != 0;
      if ((bVar7) && (*pQVar1 != QUAL_PATCH)) {
        uVar4 = lVar3 >> 2;
        uVar5 = 1;
        do {
          uVar6 = (ulong)uVar5;
          bVar7 = uVar6 < uVar4;
          if (uVar4 <= uVar6) break;
          uVar5 = uVar5 + 1;
        } while (pQVar1[uVar6] != QUAL_PATCH);
      }
      VVar2 = (uint)((bVar7 ^ 1U) & storage == INPUT);
      break;
    case GEOMETRY_SHADER:
      VVar2 = (uint)(storage == INPUT);
      break;
    default:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x473);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return VVar2;
}

Assistant:

Utils::VARIABLE_FLAVOUR Utils::getVariableFlavour(SHADER_STAGES stage, VARIABLE_STORAGE storage,
												  const qualifierSet& qualifiers)
{
	VARIABLE_FLAVOUR result;

	if (UNIFORM == storage)
	{
		result = BASIC;
	}
	else
	{
		switch (stage)
		{
		case Utils::GEOMETRY_SHADER:
			if (Utils::INPUT == storage)
			{
				result = ARRAY;
			}
			else /* OUTPUT */
			{
				result = BASIC;
			}
			break;
		case Utils::TESS_EVAL_SHADER:
			if ((false == Utils::doesContainQualifier(Utils::QUAL_PATCH, qualifiers)) && (Utils::INPUT == storage))
			{
				result = ARRAY;
			}
			else /* OUTPUT */
			{
				result = BASIC;
			}
			break;
		case Utils::TESS_CTRL_SHADER:
			if ((true == Utils::doesContainQualifier(Utils::QUAL_PATCH, qualifiers)) && (Utils::OUTPUT == storage))
			{
				result = BASIC;
			}
			else
			{
				result = INDEXED_BY_INVOCATION_ID;
			}
			break;
		case Utils::VERTEX_SHADER:
		case Utils::FRAGMENT_SHADER:
			result = BASIC;
			break;
		default:
			TCU_FAIL("Invliad enum");
			break;
		}
	}

	return result;
}